

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O0

void __thiscall bdNodeManager::addCallback(bdNodeManager *this)

{
  BitDhtCallback *in_RSI;
  
  addCallback((bdNodeManager *)&this[-1].super_bdNode.mConnMgr,in_RSI);
  return;
}

Assistant:

void bdNodeManager::addCallback(BitDhtCallback *cb) {
#ifdef DEBUG_MGR
	std::cerr << "bdNodeManager::addCallback()";
	std::cerr << std::endl;
#endif
        /* search list */
        std::list<BitDhtCallback *>::iterator it;
        it = std::find(mCallbacks.begin(), mCallbacks.end(), cb);
        if (it == mCallbacks.end()) {
                /* add it */
                mCallbacks.push_back(cb);
        }
}